

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void __thiscall
gvr::anon_unknown_3::PLYProperty::PLYProperty
          (PLYProperty *this,string *propname,ply_type type,ply_encoding encoding)

{
  pointer pcVar1;
  PLYValue *pPVar2;
  
  this->enc = encoding;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (propname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + propname->_M_string_length);
  this->tsize = ply_none;
  this->tvalue = type;
  pPVar2 = createValue(type,encoding);
  this->value = pPVar2;
  this->receiver = (PLYReceiver *)0x0;
  return;
}

Assistant:

PLYProperty::PLYProperty(const std::string &propname, ply_type type, ply_encoding encoding):
  enc(encoding), name(propname)
{
  tsize=ply_none;
  tvalue=type;
  value=createValue(type, encoding);
  receiver=0;
}